

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O3

real_t tinyobj::parseReal(char **token,double default_value)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  uint uVar4;
  size_t sVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  char *pcVar10;
  char *pcVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  pcVar10 = *token;
  sVar5 = strspn(pcVar10," \t");
  pcVar10 = pcVar10 + sVar5;
  *token = pcVar10;
  sVar5 = strcspn(pcVar10," \t\r");
  pcVar1 = pcVar10 + sVar5;
  if ((long)sVar5 < 1) goto LAB_00107423;
  cVar2 = *pcVar10;
  if ((cVar2 == '-') || (cVar2 == '+')) {
    pcVar10 = pcVar10 + 1;
    dVar13 = *(double *)(&DAT_001280b0 + (ulong)(cVar2 == '+') * 8);
  }
  else {
    if (9 < (int)cVar2 - 0x30U) goto LAB_00107423;
    dVar13 = 1.0;
  }
  if (pcVar10 == pcVar1) goto LAB_00107423;
  dVar14 = 0.0;
  iVar6 = 0;
  do {
    cVar2 = *pcVar10;
    uVar4 = (uint)cVar2;
    if (9 < uVar4 - 0x30) {
      if (iVar6 == 0) goto LAB_00107423;
      if ((cVar2 == 'e') || (cVar2 == 'E')) goto LAB_00107441;
      if ((cVar2 == '.') && (pcVar10 + 1 != pcVar1)) {
        uVar8 = 1;
        iVar6 = -1;
        goto LAB_001073ae;
      }
      break;
    }
    dVar14 = dVar14 * 10.0 + (double)(int)(uVar4 - 0x30);
    pcVar10 = pcVar10 + 1;
    iVar6 = iVar6 + 1;
  } while (pcVar10 != pcVar1);
  goto LAB_00107347;
code_r0x001073bd:
  if (uVar8 < 8) {
    dVar12 = *(double *)(tryParseDouble(char_const*,char_const*,double*)::pow_lut + uVar8 * 8);
  }
  else {
    dVar12 = pow(10.0,(double)iVar6);
  }
  dVar14 = dVar14 + (double)(int)(uVar4 - 0x30) * dVar12;
  iVar6 = iVar6 + -1;
  lVar7 = uVar8 + 1;
  uVar8 = uVar8 + 1;
  if (pcVar10 + lVar7 == pcVar1) goto LAB_00107347;
LAB_001073ae:
  uVar4 = (uint)pcVar10[uVar8];
  if (uVar4 - 0x30 < 10) goto code_r0x001073bd;
  pcVar10 = pcVar10 + uVar8;
LAB_00107441:
  if ((uVar4 & 0xff | 0x20) != 0x65) goto LAB_00107347;
  pcVar11 = pcVar10 + 1;
  cVar2 = pcVar10[1];
  if ((pcVar11 == pcVar1) || ((cVar2 != '-' && (cVar2 != '+')))) {
    iVar6 = 1;
    if (9 < (int)cVar2 - 0x30U) goto LAB_00107423;
  }
  else {
    pcVar11 = pcVar10 + 2;
    iVar6 = (uint)(cVar2 == '+') * 2 + -1;
  }
  if (pcVar11 == pcVar1) goto LAB_00107423;
  lVar7 = 0;
  iVar9 = 0;
  do {
    if (9 < (int)pcVar11[lVar7] - 0x30U) {
      if ((int)lVar7 == 0) goto LAB_00107423;
      break;
    }
    iVar9 = ((int)pcVar11[lVar7] - 0x30U) + iVar9 * 10;
    lVar3 = lVar7 + 1;
    lVar7 = lVar7 + 1;
  } while (pcVar11 + lVar3 != pcVar1);
  if (iVar9 != 0) {
    dVar12 = pow(5.0,(double)(iVar9 * iVar6));
    dVar14 = ldexp(dVar12 * dVar14,iVar9 * iVar6);
  }
LAB_00107347:
  default_value = dVar13 * dVar14;
LAB_00107423:
  *token = pcVar1;
  return (float)default_value;
}

Assistant:

static inline real_t parseReal(const char **token, double default_value = 0.0) {
  (*token) += strspn((*token), " \t");
  const char *end = (*token) + strcspn((*token), " \t\r");
  double val = default_value;
  tryParseDouble((*token), end, &val);
  real_t f = static_cast<real_t>(val);
  (*token) = end;
  return f;
}